

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

Fad<double> * __thiscall
TPZMatrix<Fad<double>_>::MatrixNorm(TPZMatrix<Fad<double>_> *this,int p,int64_t numiter,REAL tol)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  ostream *poVar4;
  void *pvVar5;
  Fad<double> *this_00;
  long in_RCX;
  int in_EDX;
  TPZBaseMatrix *in_RSI;
  Fad<double> *in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  bool result;
  TPZVec<Fad<double>_> EigenVal;
  Fad<double> sum_2;
  TPZVec<Fad<double>_> ROW;
  int64_t k;
  int64_t j_2;
  int64_t i_2;
  TPZFMatrix<Fad<double>_> transp;
  REAL sum_1;
  int64_t j_1;
  int64_t i_1;
  REAL sum;
  int64_t j;
  int64_t i;
  int64_t n;
  Fad<double> *max;
  TPZVec<Fad<double>_> *in_stack_00000460;
  REAL *in_stack_00000468;
  int64_t *in_stack_00000470;
  TPZMatrix<Fad<double>_> *in_stack_00000478;
  Fad<double> *in_stack_fffffffffffffcc8;
  Fad<double> *in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffcd8;
  Fad<double> *in_stack_fffffffffffffce0;
  int64_t in_stack_fffffffffffffce8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffcf0;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  Fad<double> *in_stack_fffffffffffffd08;
  Fad<double> *in_stack_fffffffffffffd18;
  Fad<double> *in_stack_fffffffffffffd20;
  Fad<double> *in_stack_fffffffffffffd28;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffd30;
  int64_t in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffd50;
  TPZVec<Fad<double>_> local_230;
  undefined1 local_210 [48];
  undefined8 local_1e0;
  TPZVec<Fad<double>_> local_1b8;
  undefined1 local_198 [32];
  int64_t local_178;
  long local_170;
  long local_168;
  undefined1 local_d0 [32];
  double local_b0;
  long local_a8;
  long local_a0;
  undefined8 local_98;
  undefined1 local_8d;
  undefined1 local_80 [32];
  double local_60;
  long local_58;
  long local_50;
  undefined8 local_48;
  undefined1 local_39;
  undefined8 local_38;
  int64_t local_30;
  double local_28;
  long local_20;
  int local_14;
  
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  local_14 = in_EDX;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  local_30 = iVar2;
  if (iVar2 == 0) {
    local_38 = 0;
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  else {
    iVar3 = TPZBaseMatrix::Cols(in_RSI);
    if (iVar2 != iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
                              );
      poVar4 = std::operator<<(poVar4," - matrix must be square - Rows() = ");
      iVar2 = TPZBaseMatrix::Rows(in_RSI);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," - Cols() = ");
      iVar2 = TPZBaseMatrix::Cols(in_RSI);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,iVar2);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    }
    if (local_14 == 0) {
      local_39 = 0;
      local_48 = 0;
      Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      for (local_50 = 0; local_50 < local_30; local_50 = local_50 + 1) {
        local_60 = 0.0;
        for (local_58 = 0; local_58 < local_30; local_58 = local_58 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_80,in_RSI,local_50,local_58);
          dVar6 = fabs<double>((Fad<double> *)0x1330d5a);
          local_60 = dVar6 + local_60;
          Fad<double>::~Fad(in_stack_fffffffffffffcd0);
        }
        dVar6 = local_60;
        dVar7 = fabs<double>((Fad<double> *)0x1330e04);
        if (dVar7 < dVar6) {
          Fad<double>::operator=<double,_nullptr>
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        }
      }
    }
    else if (local_14 == 1) {
      local_8d = 0;
      local_98 = 0;
      Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      for (local_a0 = 0; local_a0 < local_30; local_a0 = local_a0 + 1) {
        local_b0 = 0.0;
        for (local_a8 = 0; local_a8 < local_30; local_a8 = local_a8 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_d0,in_RSI,local_a8,local_a0);
          dVar6 = fabs<double>((Fad<double> *)0x1330f45);
          local_b0 = dVar6 + local_b0;
          Fad<double>::~Fad(in_stack_fffffffffffffcd0);
        }
        dVar6 = local_b0;
        dVar7 = fabs<double>((Fad<double> *)0x1330fe6);
        if (dVar7 < dVar6) {
          Fad<double>::operator=<double,_nullptr>
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        }
      }
    }
    else if (local_14 == 2) {
      TPZFMatrix<Fad<double>_>::TPZFMatrix
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      for (local_168 = 0; local_168 < local_30; local_168 = local_168 + 1) {
        for (local_170 = 0; local_170 < local_30; local_170 = local_170 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_198,in_RSI,local_170,local_168)
          ;
          in_stack_fffffffffffffd28 =
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                          (int64_t)in_stack_fffffffffffffce0);
          Fad<double>::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          Fad<double>::~Fad(in_stack_fffffffffffffcd0);
        }
      }
      TPZVec<Fad<double>_>::TPZVec(in_stack_fffffffffffffd30,(int64_t)in_stack_fffffffffffffd28);
      for (local_168 = 0; local_168 < local_30; local_168 = local_168 + 1) {
        for (local_170 = 0; local_170 < local_30; local_170 = local_170 + 1) {
          in_stack_fffffffffffffd20 =
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                          (int64_t)in_stack_fffffffffffffce0);
          in_stack_fffffffffffffd18 = TPZVec<Fad<double>_>::operator[](&local_1b8,local_170);
          Fad<double>::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
        }
        for (local_170 = 0; local_170 < local_30; local_170 = local_170 + 1) {
          local_1e0 = 0;
          Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          for (local_178 = 0; local_178 < local_30; local_178 = local_178 + 1) {
            TPZVec<Fad<double>_>::operator[](&local_1b8,local_178);
            (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])
                      (local_210,in_RSI,local_178,local_170);
            operator*<Fad<double>,_Fad<double>,_nullptr>
                      (in_stack_fffffffffffffd08,
                       (Fad<double> *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00))
            ;
            Fad<double>::operator+=
                      ((Fad<double> *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcf8);
            FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                      ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)
                       in_stack_fffffffffffffcd0);
            Fad<double>::~Fad(in_stack_fffffffffffffcd0);
          }
          in_stack_fffffffffffffd08 =
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                          (int64_t)in_stack_fffffffffffffce0);
          Fad<double>::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          Fad<double>::~Fad(in_stack_fffffffffffffcd0);
        }
      }
      TPZVec<Fad<double>_>::TPZVec(&local_230);
      bVar1 = SolveEigenvaluesJacobi
                        (in_stack_00000478,in_stack_00000470,in_stack_00000468,in_stack_00000460);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
                                );
        in_stack_fffffffffffffcf0 =
             (TPZFMatrix<Fad<double>_> *)
             std::operator<<(poVar4," - it was not possible to find Eigenvalues. Iterations = ");
        poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffcf0,local_20);
        poVar4 = std::operator<<(poVar4," - error found = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_28);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      this_00 = TPZVec<Fad<double>_>::operator[](&local_230,0);
      sqrt<double>(in_stack_fffffffffffffd08);
      Fad<double>::Fad<FadFuncSqrt<Fad<double>>>
                (in_stack_fffffffffffffd20,
                 (FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffffd18);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr((FadExpr<FadFuncSqrt<Fad<double>_>_> *)this_00);
      TPZVec<Fad<double>_>::~TPZVec((TPZVec<Fad<double>_> *)in_stack_fffffffffffffcf0);
      TPZVec<Fad<double>_>::~TPZVec((TPZVec<Fad<double>_> *)in_stack_fffffffffffffcf0);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x133160d);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
                              );
      poVar4 = std::operator<<(poVar4," p = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
      poVar4 = std::operator<<(poVar4," is not a correct option");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    }
  }
  return in_RDI;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}